

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void cpu_x86_cpuid_x86_64
               (CPUX86State *env,uint32_t index,uint32_t count,uint32_t *eax,uint32_t *ebx,
               uint32_t *ecx,uint32_t *edx)

{
  uint8_t uVar1;
  uint count_00;
  ulong uVar2;
  uint64_t uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint32_t uVar13;
  int iVar14;
  unsigned_long uVar15;
  CPUCacheInfo *pCVar16;
  uint uVar17;
  int num_cores;
  CPUCacheInfo *pCVar18;
  uint uVar19;
  X86CPUTopoInfo topo_info;
  unsigned_long local_38;
  
  uVar17 = env->nr_nodes;
  uVar11 = env->nr_dies;
  uVar10 = (uint)env[-6].mtrr_var[4].base;
  count_00 = *(uint *)((long)&env[-6].mtrr_var[4].base + 4);
  if (index < 0xc0000000) {
    if ((int)index < 0) {
      uVar7 = env->cpuid_xlevel;
    }
    else {
      uVar7 = 0x40000001;
      if (index < 0x40000000) {
        uVar7 = env->cpuid_level;
      }
    }
  }
  else {
    uVar7 = env->cpuid_xlevel2;
  }
  if (uVar7 < index) {
    index = env->cpuid_level;
  }
  topo_info.nodes_per_pkg = uVar17;
  topo_info.dies_per_pkg = uVar11;
  topo_info.cores_per_die = uVar10;
  topo_info.threads_per_core = count_00;
  switch(index) {
  case 0:
    uVar13 = env->cpuid_level;
LAB_004c6ce3:
    *eax = uVar13;
    *ebx = env->cpuid_vendor1;
    *edx = env->cpuid_vendor2;
    *ecx = env->cpuid_vendor3;
    break;
  case 1:
    *eax = env->cpuid_version;
    *ebx = (int)env[1].regs[2] << 0x18 | 0x800;
    uVar17 = (uint)env->features[1];
    *ecx = uVar17;
    if (((uVar17 >> 0x1a & 1) != 0) && ((*(byte *)((long)env->cr + 0x22) & 4) != 0)) {
      *ecx = uVar17 | 0x8000000;
    }
    *edx = (uint32_t)env->features[0];
    iVar14 = *(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base;
    if (1 < iVar14) {
      *ebx = *ebx | iVar14 * 0x10000;
      *(byte *)((long)edx + 3) = *(byte *)((long)edx + 3) | 0x10;
    }
    break;
  case 2:
    if (*(char *)((long)env[1].regs + 0x15) != '\x01') {
      *eax = 1;
      *ebx = 0;
      uVar17 = 0;
      if (*(char *)((long)&env[1].segs[5].base + 2) == '\x01') {
        bVar4 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l3_cache);
        uVar17 = (uint)bVar4;
      }
      *ecx = uVar17;
      bVar4 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l1d_cache);
      bVar5 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l1i_cache);
      bVar6 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l2_cache);
      *edx = (uint)bVar6 | (uint)bVar5 << 8 | (uint)bVar4 << 0x10;
      return;
    }
    uVar13 = 2;
    goto LAB_004c6d8c;
  case 3:
  case 8:
  case 9:
  case 10:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
    goto switchD_004c68fb_caseD_80000009;
  case 4:
    if (*(char *)((long)env[1].regs + 0x15) == '\x01') {
      host_cpuid_x86_64(4,count,eax,ebx,ecx,edx);
      uVar17 = *eax;
      uVar11 = uVar17 & 0x3ffffff;
      *eax = uVar11;
      if ((uVar17 & 0x1f) == 0) {
        return;
      }
      iVar14 = (int)env[-6].mtrr_var[4].base;
      if (iVar14 < 2) {
        return;
      }
      uVar13 = uVar11 + iVar14 * 0x4000000 + 0xfc000000;
      goto LAB_004c7228;
    }
    *eax = 0;
    switch(count) {
    case 0:
      pCVar18 = (env->cache_info_cpuid4).l1d_cache;
      goto LAB_004c738f;
    case 1:
      pCVar18 = (env->cache_info_cpuid4).l1i_cache;
LAB_004c738f:
      num_cores = (int)env[-6].mtrr_var[4].base;
      iVar14 = 1;
      break;
    case 2:
      pCVar18 = (env->cache_info_cpuid4).l2_cache;
      num_cores = (int)env[-6].mtrr_var[4].base;
      iVar14 = *(int *)((long)&env[-6].mtrr_var[4].base + 4);
      break;
    case 3:
      uVar17 = apicid_die_offset(&topo_info);
      if (*(char *)((long)&env[1].segs[5].base + 2) != '\x01') goto switchD_004c70a1_default;
      pCVar18 = (env->cache_info_cpuid4).l3_cache;
      iVar14 = 1 << ((byte)uVar17 & 0x1f);
      num_cores = (int)env[-6].mtrr_var[4].base;
      break;
    default:
      goto switchD_004c70a1_default;
    }
    encode_cache_cpuid4(pCVar18,iVar14,num_cores,eax,ebx,ecx,edx);
    break;
  case 5:
    *eax = (uint32_t)env[1].regs[3];
    *ebx = *(uint32_t *)((long)env[1].regs + 0x1c);
    *ecx = (uint32_t)env[1].regs[4];
    uVar17 = *(uint *)((long)env[1].regs + 0x24);
    goto LAB_004c750e;
  case 6:
    uVar13 = (uint32_t)env->features[0x14];
LAB_004c70f4:
    *eax = uVar13;
    goto LAB_004c70f8;
  case 7:
    if (count == 1) {
      uVar13 = (uint32_t)env->features[5];
      goto LAB_004c70f4;
    }
    if (count == 0) {
      *eax = env->cpuid_level_func7;
      *ebx = (uint32_t)env->features[2];
      uVar17 = (uint)env->features[3];
      *ecx = uVar17;
      if (((uVar17 & 8) != 0) && ((*(byte *)((long)env->cr + 0x22) & 0x40) != 0)) {
        *ecx = uVar17 | 0x10;
      }
      uVar17 = (uint)env->features[4];
      goto LAB_004c750e;
    }
    goto switchD_004c68fb_caseD_80000009;
  case 0xb:
    if (*(char *)((long)&env[1].segs[5].base + 4) != '\0') {
      *ecx = count & 0xff;
      *edx = (uint32_t)env[1].regs[2];
      if (count == 1) {
        *eax = env->pkg_offset;
        *ebx = *(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base;
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 2;
      }
      else if (count == 0) {
        uVar17 = apicid_bitwidth_for_count(count_00);
        *eax = uVar17;
        *ebx = *(uint32_t *)((long)&env[-6].mtrr_var[4].base + 4);
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 1;
      }
      else {
        *eax = 0;
        *ebx = 0;
      }
      if (0x1f < *eax) {
        __assert_fail("!(*eax & ~0x1f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                      ,0x1057,
                      "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                     );
      }
LAB_004c730e:
      *ebx = (uint)(ushort)*ebx;
      return;
    }
    goto switchD_004c70a1_default;
  case 0xd:
    *eax = 0;
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
    if ((*(byte *)((long)env->features + 0xb) & 4) == 0) {
      return;
    }
    if (count != 1) {
      if (count == 0) {
        uVar2 = env->features[0x15];
        uVar3 = env->features[0x16];
        uVar13 = xsave_area_size(uVar3 << 0x20 | uVar2);
        *ecx = uVar13;
        *eax = (uint32_t)uVar2;
        *edx = (uint32_t)uVar3;
        uVar13 = xsave_area_size(env->xcr0);
        *ebx = uVar13;
        return;
      }
      if (9 < count) {
        return;
      }
      uVar2 = (ulong)count;
      if ((env->features[0x15] >> (uVar2 & 0x3f) & 1) == 0) {
        return;
      }
      uVar13 = x86_ext_save_areas[uVar2].offset;
      *eax = x86_ext_save_areas[uVar2].size;
      *ebx = uVar13;
      return;
    }
    uVar13 = (uint32_t)env->features[0x13];
LAB_004c7228:
    *eax = uVar13;
    break;
  case 0x14:
    *eax = 0;
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
    if ((*(byte *)((long)env->features + 0x13) & 2) != 0) {
      if (count == 1) {
        *eax = 0x2490002;
        *ebx = 0x3f1fff;
      }
      else if (count == 0) {
        *eax = 1;
        *ebx = 0xf;
        *ecx = 7;
      }
    }
    break;
  case 0x1f:
    if (1 < uVar11) {
      *ecx = count & 0xff;
      *edx = (uint32_t)env[1].regs[2];
      if (count == 2) {
        *eax = env->pkg_offset;
        *ebx = (int)env[-6].mtrr_var[4].base * env->nr_dies *
               *(int *)((long)&env[-6].mtrr_var[4].base + 4);
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 5;
      }
      else if (count == 1) {
        uVar17 = apicid_die_offset(&topo_info);
        *eax = uVar17;
        *ebx = *(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base;
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 2;
      }
      else if (count == 0) {
        uVar17 = apicid_bitwidth_for_count(count_00);
        *eax = uVar17;
        *ebx = *(uint32_t *)((long)&env[-6].mtrr_var[4].base + 4);
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 1;
      }
      else {
        *eax = 0;
        *ebx = 0;
      }
      if (0x1f < *eax) {
        __assert_fail("!(*eax & ~0x1f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                      ,0x1078,
                      "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                     );
      }
      goto LAB_004c730e;
    }
switchD_004c70a1_default:
    *edx = 0;
    *ecx = 0;
    *ebx = 0;
    *eax = 0;
    break;
  default:
    switch(index) {
    case 0x80000000:
      uVar13 = env->cpuid_xlevel;
      goto LAB_004c6ce3;
    case 0x80000001:
      *eax = env->cpuid_version;
      *ebx = 0;
      *ecx = (uint32_t)env->features[7];
      *edx = (uint32_t)env->features[6];
      if (*(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base < 2) {
        return;
      }
      if (((env->cpuid_vendor1 == 0x756e6547) && (env->cpuid_vendor2 == 0x49656e69)) &&
         (env->cpuid_vendor3 == 0x6c65746e)) {
        return;
      }
      *(byte *)ecx = (byte)*ecx | 2;
      return;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
      *eax = env->cpuid_model[index * 4 - 8];
      *ebx = env->cpuid_model[index * 4 - 7];
      *ecx = env->cpuid_model[index * 4 - 6];
      uVar17 = env->cpuid_model[index * 4 - 5];
      goto LAB_004c750e;
    case 0x80000005:
      if (*(char *)((long)env[1].regs + 0x15) != '\x01') {
        *eax = 0x1ff01ff;
        *ebx = 0x1ff01ff;
        uVar13 = encode_cache_cpuid80000005((env->cache_info_amd).l1d_cache);
        *ecx = uVar13;
        uVar13 = encode_cache_cpuid80000005((env->cache_info_amd).l1i_cache);
        *edx = uVar13;
        return;
      }
      uVar13 = 0x80000005;
      goto LAB_004c6d8c;
    case 0x80000006:
      if (*(char *)((long)env[1].regs + 0x15) != '\x01') {
        *eax = 0;
        *ebx = 0x42004200;
        pCVar18 = (env->cache_info_amd).l2_cache;
        if (*(char *)((long)&env[1].segs[5].base + 2) == '\x01') {
          pCVar16 = (env->cache_info_amd).l3_cache;
        }
        else {
          pCVar16 = (CPUCacheInfo *)0x0;
        }
        if ((pCVar18->size & 0x3ff) != 0) {
          __assert_fail("l2->size % 1024 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x127,
                        "void encode_cache_cpuid80000006(CPUCacheInfo *, CPUCacheInfo *, uint32_t *, uint32_t *)"
                       );
        }
        uVar1 = pCVar18->associativity;
        if (uVar1 == '\0') {
          __assert_fail("l2->associativity > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x128,
                        "void encode_cache_cpuid80000006(CPUCacheInfo *, CPUCacheInfo *, uint32_t *, uint32_t *)"
                       );
        }
        if (pCVar18->lines_per_tag == 0) {
          __assert_fail("l2->lines_per_tag > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x129,
                        "void encode_cache_cpuid80000006(CPUCacheInfo *, CPUCacheInfo *, uint32_t *, uint32_t *)"
                       );
        }
        if (pCVar18->line_size == 0) {
          __assert_fail("l2->line_size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x12a,
                        "void encode_cache_cpuid80000006(CPUCacheInfo *, CPUCacheInfo *, uint32_t *, uint32_t *)"
                       );
        }
        switch(uVar1) {
        case '\x01':
          uVar17 = 0x1000;
          break;
        case '\x02':
          uVar17 = 0x2000;
          break;
        case '\x03':
        case '\x05':
        case '\x06':
        case '\a':
switchD_004c71dc_caseD_3:
          uVar17 = 0xf000;
          if (uVar1 != 0xff) {
            uVar17 = 0;
          }
          break;
        case '\x04':
          uVar17 = 0x4000;
          break;
        case '\b':
          uVar17 = 0x6000;
          break;
        default:
          if (uVar1 == '\x10') {
            uVar17 = 0x8000;
          }
          else if (uVar1 == ' ') {
            uVar17 = 0xa000;
          }
          else if (uVar1 == '0') {
            uVar17 = 0xb000;
          }
          else if (uVar1 == '@') {
            uVar17 = 0xc000;
          }
          else if (uVar1 == '`') {
            uVar17 = 0xd000;
          }
          else {
            if (uVar1 != 0x80) goto switchD_004c71dc_caseD_3;
            uVar17 = 0xe000;
          }
        }
        *ecx = (uint)pCVar18->lines_per_tag << 8 | (uint)pCVar18->line_size |
               uVar17 | pCVar18->size << 6;
        if (pCVar16 == (CPUCacheInfo *)0x0) {
          uVar17 = 0;
          goto LAB_004c750e;
        }
        if ((pCVar16->size & 0x7ffff) != 0) {
          __assert_fail("l3->size % (512 * 1024) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x130,
                        "void encode_cache_cpuid80000006(CPUCacheInfo *, CPUCacheInfo *, uint32_t *, uint32_t *)"
                       );
        }
        uVar1 = pCVar16->associativity;
        if (uVar1 == '\0') {
          __assert_fail("l3->associativity > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x131,
                        "void encode_cache_cpuid80000006(CPUCacheInfo *, CPUCacheInfo *, uint32_t *, uint32_t *)"
                       );
        }
        if (pCVar16->lines_per_tag == 0) {
          __assert_fail("l3->lines_per_tag > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x132,
                        "void encode_cache_cpuid80000006(CPUCacheInfo *, CPUCacheInfo *, uint32_t *, uint32_t *)"
                       );
        }
        if (pCVar16->line_size == 0) {
          __assert_fail("l3->line_size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x133,
                        "void encode_cache_cpuid80000006(CPUCacheInfo *, CPUCacheInfo *, uint32_t *, uint32_t *)"
                       );
        }
        switch(uVar1) {
        case '\x01':
          uVar17 = 0x1000;
          break;
        case '\x02':
          uVar17 = 0x2000;
          break;
        case '\x03':
        case '\x05':
        case '\x06':
        case '\a':
switchD_004c74b4_caseD_3:
          uVar17 = 0xf000;
          if (uVar1 != 0xff) {
            uVar17 = 0;
          }
          break;
        case '\x04':
          uVar17 = 0x4000;
          break;
        case '\b':
          uVar17 = 0x6000;
          break;
        default:
          if (uVar1 == '\x10') {
            uVar17 = 0x8000;
          }
          else if (uVar1 == ' ') {
            uVar17 = 0xa000;
          }
          else if (uVar1 == '0') {
            uVar17 = 0xb000;
          }
          else if (uVar1 == '@') {
            uVar17 = 0xc000;
          }
          else if (uVar1 == '`') {
            uVar17 = 0xd000;
          }
          else {
            if (uVar1 != 0x80) goto switchD_004c74b4_caseD_3;
            uVar17 = 0xe000;
          }
        }
        uVar17 = pCVar16->line_size | uVar17 |
                 (uint)pCVar16->lines_per_tag << 8 | pCVar16->size >> 1;
        goto LAB_004c750e;
      }
      uVar13 = 0x80000006;
LAB_004c6d8c:
      count = 0;
LAB_004c6f6d:
      host_cpuid_x86_64(uVar13,count,eax,ebx,ecx,edx);
      return;
    case 0x80000007:
      *eax = 0;
      *ebx = 0;
      *ecx = 0;
      uVar17 = (uint)env->features[8];
LAB_004c750e:
      *edx = uVar17;
      return;
    case 0x80000008:
      uVar17 = env[1].segs[5].flags;
      if ((*(byte *)((long)env->features + 0x33) & 0x20) != 0) {
        if ((*(byte *)((long)env->features + 0x1a) & 1) == 0) {
          uVar17 = uVar17 | 0x3000;
        }
        else {
          uVar17 = uVar17 | 0x3900;
        }
      }
      *eax = uVar17;
      *ebx = (uint32_t)env->features[9];
      *ecx = 0;
      *edx = 0;
      iVar14 = *(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base;
      if (iVar14 < 2) {
        return;
      }
      *ecx = *ecx | iVar14 - 1U;
      return;
    case 0x80000009:
      break;
    case 0x8000000a:
      if ((env->features[7] & 4) != 0) {
        *eax = 1;
        *ebx = 0x10;
        *ecx = 0;
        uVar17 = (uint)env->features[0x12];
        goto LAB_004c750e;
      }
      break;
    default:
      if (2 < index + 0x3ffffffe) {
        if (index == 0x8000001d) {
          *eax = 0;
          if (*(char *)((long)env[1].regs + 0x15) == '\x01') {
            uVar13 = 0x8000001d;
            goto LAB_004c6f6d;
          }
          switch(count) {
          case 0:
            pCVar18 = (env->cache_info_amd).l1d_cache;
            break;
          case 1:
            pCVar18 = (env->cache_info_amd).l1i_cache;
            break;
          case 2:
            pCVar18 = (env->cache_info_amd).l2_cache;
            break;
          case 3:
            pCVar18 = (env->cache_info_amd).l3_cache;
            break;
          default:
            goto switchD_004c70a1_default;
          }
          encode_cache_cpuid8000001d(pCVar18,&topo_info,eax,ebx,ecx,edx);
          return;
        }
        if (index == 0x8000001e) {
          if (*(int *)((long)&env[1].ldt.base + 4) < 0x100) {
            uVar8 = uVar17 + (uVar17 == 0);
            uVar7 = (uint)env[1].regs[2];
            apicid_bitwidth_for_count(count_00);
            uVar9 = apicid_bitwidth_for_count(count_00);
            uVar10 = apicid_bitwidth_for_count(uVar10);
            apicid_die_offset(&topo_info);
            apicid_bitwidth_for_count(uVar11);
            uVar11 = apicid_node_offset_epyc(&topo_info);
            uVar12 = apicid_node_width_epyc(&topo_info);
            uVar19 = ~(uint)(0xffffffffL << ((byte)uVar12 & 0x3f)) & uVar7 >> ((byte)uVar11 & 0x1f);
            uVar11 = apicid_node_offset_epyc(&topo_info);
            uVar12 = apicid_node_width_epyc(&topo_info);
            uVar11 = uVar7 >> ((char)uVar11 + (char)uVar12 & 0x1fU);
            *eax = (uint32_t)env[1].regs[2];
            *ebx = uVar19 * 8 | count_00 * 0x100 - 0x100 |
                   ~(uint)(0xffffffffL << ((byte)uVar10 & 0x3f)) & uVar7 >> ((byte)uVar9 & 0x1f);
            if (uVar17 < 5) {
              uVar11 = uVar11 << 2;
              uVar17 = uVar8 * 0x100 - 0x100;
            }
            else {
              local_38 = (ulong)uVar8 - 1;
              uVar15 = find_last_bit(&local_38,8);
              uVar11 = uVar11 << ((char)uVar15 + 1U & 0x1f);
              uVar17 = (int)local_38 << 8;
            }
            *ecx = uVar17 | uVar11 | uVar19;
            *edx = 0;
            return;
          }
          __assert_fail("cpu->core_id <= 255",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                        ,0x114b,
                        "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                       );
        }
        if (index == 0xc0000000) {
          uVar13 = env->cpuid_xlevel2;
          goto LAB_004c70f4;
        }
        if (index == 0xc0000001) {
          *eax = env->cpuid_version;
          *ebx = 0;
          *ecx = 0;
          uVar17 = (uint)env->features[10];
          goto LAB_004c750e;
        }
        if ((index == 0x40000000) && (*(char *)((long)env[1].regs + 0xc) == '\x01')) {
          *eax = 0x40000001;
          *ebx = 0x54474354;
          *ecx = 0x43544743;
          *edx = 0x47435447;
          return;
        }
      }
    }
switchD_004c68fb_caseD_80000009:
    *eax = 0;
LAB_004c70f8:
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
  }
  return;
}

Assistant:

void cpu_x86_cpuid(CPUX86State *env, uint32_t index, uint32_t count,
                   uint32_t *eax, uint32_t *ebx,
                   uint32_t *ecx, uint32_t *edx)
{
    X86CPU *cpu = env_archcpu(env);
    CPUState *cs = env_cpu(env);
    uint32_t die_offset;
    uint32_t limit;
    uint32_t signature[3];
    X86CPUTopoInfo topo_info;

    topo_info.nodes_per_pkg = env->nr_nodes;
    topo_info.dies_per_pkg = env->nr_dies;
    topo_info.cores_per_die = cs->nr_cores;
    topo_info.threads_per_core = cs->nr_threads;

    /* Calculate & apply limits for different index ranges */
    if (index >= 0xC0000000) {
        limit = env->cpuid_xlevel2;
    } else if (index >= 0x80000000) {
        limit = env->cpuid_xlevel;
    } else if (index >= 0x40000000) {
        limit = 0x40000001;
    } else {
        limit = env->cpuid_level;
    }

    if (index > limit) {
        /* Intel documentation states that invalid EAX input will
         * return the same information as EAX=cpuid_level
         * (Intel SDM Vol. 2A - Instruction Set Reference - CPUID)
         */
        index = env->cpuid_level;
    }

    switch(index) {
    case 0:
        *eax = env->cpuid_level;
        *ebx = env->cpuid_vendor1;
        *edx = env->cpuid_vendor2;
        *ecx = env->cpuid_vendor3;
        break;
    case 1:
        *eax = env->cpuid_version;
        *ebx = (cpu->apic_id << 24) |
               8 << 8; /* CLFLUSH size in quad words, Linux wants it. */
        *ecx = env->features[FEAT_1_ECX];
        if ((*ecx & CPUID_EXT_XSAVE) && (env->cr[4] & CR4_OSXSAVE_MASK)) {
            *ecx |= CPUID_EXT_OSXSAVE;
        }
        *edx = env->features[FEAT_1_EDX];
        if (cs->nr_cores * cs->nr_threads > 1) {
            *ebx |= (cs->nr_cores * cs->nr_threads) << 16;
            *edx |= CPUID_HT;
        }
        break;
    case 2:
        /* cache info: needed for Pentium Pro compatibility */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = 1; /* Number of CPUID[EAX=2] calls required */
        *ebx = 0;
        if (!cpu->enable_l3_cache) {
            *ecx = 0;
        } else {
            *ecx = cpuid2_cache_descriptor(env->cache_info_cpuid2.l3_cache);
        }
        *edx = (cpuid2_cache_descriptor(env->cache_info_cpuid2.l1d_cache) << 16) |
               (cpuid2_cache_descriptor(env->cache_info_cpuid2.l1i_cache) <<  8) |
               (cpuid2_cache_descriptor(env->cache_info_cpuid2.l2_cache));
        break;
    case 4:
        /* cache info: needed for Core compatibility */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, count, eax, ebx, ecx, edx);
            /* QEMU gives out its own APIC IDs, never pass down bits 31..26.  */
            *eax &= ~0xFC000000;
            if ((*eax & 31) && cs->nr_cores > 1) {
                *eax |= (cs->nr_cores - 1) << 26;
            }
        } else {
            *eax = 0;
            switch (count) {
            case 0: /* L1 dcache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l1d_cache,
                                    1, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 1: /* L1 icache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l1i_cache,
                                    1, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 2: /* L2 cache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l2_cache,
                                    cs->nr_threads, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 3: /* L3 cache info */
                die_offset = apicid_die_offset(&topo_info);
                if (cpu->enable_l3_cache) {
                    encode_cache_cpuid4(env->cache_info_cpuid4.l3_cache,
                                        (1 << die_offset), cs->nr_cores,
                                        eax, ebx, ecx, edx);
                    break;
                }
                /* fall through */
            default: /* end of info */
                *eax = *ebx = *ecx = *edx = 0;
                break;
            }
        }
        break;
    case 5:
        /* MONITOR/MWAIT Leaf */
        *eax = cpu->mwait.eax; /* Smallest monitor-line size in bytes */
        *ebx = cpu->mwait.ebx; /* Largest monitor-line size in bytes */
        *ecx = cpu->mwait.ecx; /* flags */
        *edx = cpu->mwait.edx; /* mwait substates */
        break;
    case 6:
        /* Thermal and Power Leaf */
        *eax = env->features[FEAT_6_EAX];
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 7:
        /* Structured Extended Feature Flags Enumeration Leaf */
        if (count == 0) {
            /* Maximum ECX value for sub-leaves */
            *eax = env->cpuid_level_func7;
            *ebx = env->features[FEAT_7_0_EBX]; /* Feature flags */
            *ecx = env->features[FEAT_7_0_ECX]; /* Feature flags */
            if ((*ecx & CPUID_7_0_ECX_PKU) && env->cr[4] & CR4_PKE_MASK) {
                *ecx |= CPUID_7_0_ECX_OSPKE;
            }
            *edx = env->features[FEAT_7_0_EDX]; /* Feature flags */
        } else if (count == 1) {
            *eax = env->features[FEAT_7_1_EAX];
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 9:
        /* Direct Cache Access Information Leaf */
        *eax = 0; /* Bits 0-31 in DCA_CAP MSR */
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xA:
        /* Architectural Performance Monitoring Leaf */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xB:
        /* Extended Topology Enumeration Leaf */
        if (!cpu->enable_cpuid_0xb) {
                *eax = *ebx = *ecx = *edx = 0;
                break;
        }

        *ecx = count & 0xff;
        *edx = cpu->apic_id;

        switch (count) {
        case 0:
            *eax = apicid_core_offset(&topo_info);
            *ebx = cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_SMT;
            break;
        case 1:
            *eax = env->pkg_offset;
            *ebx = cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_CORE;
            break;
        default:
            *eax = 0;
            *ebx = 0;
            *ecx |= CPUID_TOPOLOGY_LEVEL_INVALID;
        }

        assert(!(*eax & ~0x1f));
        *ebx &= 0xffff; /* The count doesn't need to be reliable. */
        break;
    case 0x1F:
        /* V2 Extended Topology Enumeration Leaf */
        if (env->nr_dies < 2) {
            *eax = *ebx = *ecx = *edx = 0;
            break;
        }

        *ecx = count & 0xff;
        *edx = cpu->apic_id;
        switch (count) {
        case 0:
            *eax = apicid_core_offset(&topo_info);
            *ebx = cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_SMT;
            break;
        case 1:
            *eax = apicid_die_offset(&topo_info);
            *ebx = cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_CORE;
            break;
        case 2:
            *eax = env->pkg_offset;
            *ebx = env->nr_dies * cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_DIE;
            break;
        default:
            *eax = 0;
            *ebx = 0;
            *ecx |= CPUID_TOPOLOGY_LEVEL_INVALID;
        }
        assert(!(*eax & ~0x1f));
        *ebx &= 0xffff; /* The count doesn't need to be reliable. */
        break;
    case 0xD: {
        /* Processor Extended State */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        if (!(env->features[FEAT_1_ECX] & CPUID_EXT_XSAVE)) {
            break;
        }

        if (count == 0) {
            *ecx = xsave_area_size(x86_cpu_xsave_components(cpu));
            *eax = env->features[FEAT_XSAVE_COMP_LO];
            *edx = env->features[FEAT_XSAVE_COMP_HI];
            /*
             * The initial value of xcr0 and ebx == 0, On host without kvm
             * commit 412a3c41(e.g., CentOS 6), the ebx's value always == 0
             * even through guest update xcr0, this will crash some legacy guest
             * (e.g., CentOS 6), So set ebx == ecx to workaroud it.
             */
            *ebx = xsave_area_size(env->xcr0);
        } else if (count == 1) {
            *eax = env->features[FEAT_XSAVE];
        } else if (count < ARRAY_SIZE(x86_ext_save_areas)) {
            if ((x86_cpu_xsave_components(cpu) >> count) & 1) {
                const ExtSaveArea *esa = &x86_ext_save_areas[count];
                *eax = esa->size;
                *ebx = esa->offset;
            }
        }
        break;
    }
    case 0x14: {
        /* Intel Processor Trace Enumeration */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        if (!(env->features[FEAT_7_0_EBX] & CPUID_7_0_EBX_INTEL_PT)) {
            break;
        }

        if (count == 0) {
            *eax = INTEL_PT_MAX_SUBLEAF;
            *ebx = INTEL_PT_MINIMAL_EBX;
            *ecx = INTEL_PT_MINIMAL_ECX;
        } else if (count == 1) {
            *eax = INTEL_PT_MTC_BITMAP | INTEL_PT_ADDR_RANGES_NUM;
            *ebx = INTEL_PT_PSB_BITMAP | INTEL_PT_CYCLE_BITMAP;
        }
        break;
    }
    case 0x40000000:
        /*
         * CPUID code in kvm_arch_init_vcpu() ignores stuff
         * set here, but we restrict to TCG none the less.
         */
        if (cpu->expose_tcg) {
            memcpy(signature, "TCGTCGTCGTCG", 12);
            *eax = 0x40000001;
            *ebx = signature[0];
            *ecx = signature[1];
            *edx = signature[2];
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 0x40000001:
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0x80000000:
        *eax = env->cpuid_xlevel;
        *ebx = env->cpuid_vendor1;
        *edx = env->cpuid_vendor2;
        *ecx = env->cpuid_vendor3;
        break;
    case 0x80000001:
        *eax = env->cpuid_version;
        *ebx = 0;
        *ecx = env->features[FEAT_8000_0001_ECX];
        *edx = env->features[FEAT_8000_0001_EDX];

        /* The Linux kernel checks for the CMPLegacy bit and
         * discards multiple thread information if it is set.
         * So don't set it here for Intel to make Linux guests happy.
         */
        if (cs->nr_cores * cs->nr_threads > 1) {
            if (env->cpuid_vendor1 != CPUID_VENDOR_INTEL_1 ||
                env->cpuid_vendor2 != CPUID_VENDOR_INTEL_2 ||
                env->cpuid_vendor3 != CPUID_VENDOR_INTEL_3) {
                *ecx |= 1 << 1;    /* CmpLegacy bit */
            }
        }
        break;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
        *eax = env->cpuid_model[(index - 0x80000002) * 4 + 0];
        *ebx = env->cpuid_model[(index - 0x80000002) * 4 + 1];
        *ecx = env->cpuid_model[(index - 0x80000002) * 4 + 2];
        *edx = env->cpuid_model[(index - 0x80000002) * 4 + 3];
        break;
    case 0x80000005:
        /* cache info (L1 cache) */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = (L1_DTLB_2M_ASSOC << 24) | (L1_DTLB_2M_ENTRIES << 16) | \
               (L1_ITLB_2M_ASSOC <<  8) | (L1_ITLB_2M_ENTRIES);
        *ebx = (L1_DTLB_4K_ASSOC << 24) | (L1_DTLB_4K_ENTRIES << 16) | \
               (L1_ITLB_4K_ASSOC <<  8) | (L1_ITLB_4K_ENTRIES);
        *ecx = encode_cache_cpuid80000005(env->cache_info_amd.l1d_cache);
        *edx = encode_cache_cpuid80000005(env->cache_info_amd.l1i_cache);
        break;
    case 0x80000006:
        /* cache info (L2 cache) */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = (AMD_ENC_ASSOC(L2_DTLB_2M_ASSOC) << 28) | \
               (L2_DTLB_2M_ENTRIES << 16) | \
               (AMD_ENC_ASSOC(L2_ITLB_2M_ASSOC) << 12) | \
               (L2_ITLB_2M_ENTRIES);
        *ebx = (AMD_ENC_ASSOC(L2_DTLB_4K_ASSOC) << 28) | \
               (L2_DTLB_4K_ENTRIES << 16) | \
               (AMD_ENC_ASSOC(L2_ITLB_4K_ASSOC) << 12) | \
               (L2_ITLB_4K_ENTRIES);
        encode_cache_cpuid80000006(env->cache_info_amd.l2_cache,
                                   cpu->enable_l3_cache ?
                                   env->cache_info_amd.l3_cache : NULL,
                                   ecx, edx);
        break;
    case 0x80000007:
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = env->features[FEAT_8000_0007_EDX];
        break;
    case 0x80000008:
        /* virtual & phys address size in low 2 bytes. */
        if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_LM) {
            /* 64 bit processor */
            *eax = cpu->phys_bits; /* configurable physical bits */
            if  (env->features[FEAT_7_0_ECX] & CPUID_7_0_ECX_LA57) {
                *eax |= 0x00003900; /* 57 bits virtual */
            } else {
                *eax |= 0x00003000; /* 48 bits virtual */
            }
        } else {
            *eax = cpu->phys_bits;
        }
        *ebx = env->features[FEAT_8000_0008_EBX];
        *ecx = 0;
        *edx = 0;
        if (cs->nr_cores * cs->nr_threads > 1) {
            *ecx |= (cs->nr_cores * cs->nr_threads) - 1;
        }
        break;
    case 0x8000000A:
        if (env->features[FEAT_8000_0001_ECX] & CPUID_EXT3_SVM) {
            *eax = 0x00000001; /* SVM Revision */
            *ebx = 0x00000010; /* nr of ASIDs */
            *ecx = 0;
            *edx = env->features[FEAT_SVM]; /* optional features */
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 0x8000001D:
        *eax = 0;
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, count, eax, ebx, ecx, edx);
            break;
        }
        switch (count) {
        case 0: /* L1 dcache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l1d_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 1: /* L1 icache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l1i_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 2: /* L2 cache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l2_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 3: /* L3 cache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l3_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        default: /* end of info */
            *eax = *ebx = *ecx = *edx = 0;
            break;
        }
        break;
    case 0x8000001E:
        assert(cpu->core_id <= 255);
        encode_topo_cpuid8000001e(&topo_info, cpu, eax, ebx, ecx, edx);
        break;
    case 0xC0000000:
        *eax = env->cpuid_xlevel2;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xC0000001:
        /* Support for VIA CPU's CPUID instruction */
        *eax = env->cpuid_version;
        *ebx = 0;
        *ecx = 0;
        *edx = env->features[FEAT_C000_0001_EDX];
        break;
    case 0xC0000002:
    case 0xC0000003:
    case 0xC0000004:
        /* Reserved for the future, and now filled with zero */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    default:
        /* reserved values: zero */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    }
}